

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

StringRef llvm::Triple::getVendorTypeName(VendorType Kind)

{
  StringRef SVar1;
  
  if (Kind < (LastVendorType|Apple)) {
    SVar1.Data = &DAT_00205f30 + *(int *)(&DAT_00205f30 + (ulong)Kind * 4);
    SVar1.Length = *(size_t *)(&DAT_00205ea8 + (ulong)Kind * 8);
    return SVar1;
  }
  llvm_unreachable_internal
            ("Invalid VendorType!",
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
             ,0xae);
}

Assistant:

StringRef Triple::getVendorTypeName(VendorType Kind) {
  switch (Kind) {
  case UnknownVendor: return "unknown";

  case Apple: return "apple";
  case PC: return "pc";
  case SCEI: return "scei";
  case BGP: return "bgp";
  case BGQ: return "bgq";
  case Freescale: return "fsl";
  case IBM: return "ibm";
  case ImaginationTechnologies: return "img";
  case MipsTechnologies: return "mti";
  case NVIDIA: return "nvidia";
  case CSR: return "csr";
  case Myriad: return "myriad";
  case AMD: return "amd";
  case Mesa: return "mesa";
  case SUSE: return "suse";
  case OpenEmbedded: return "oe";
  }

  llvm_unreachable("Invalid VendorType!");
}